

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O1

void memXor(void *dest,void *src1,void *src2,size_t count)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  
  if (7 < count) {
    lVar4 = 0;
    lVar2 = 0;
    do {
      *(ulong *)((long)dest + lVar4) =
           *(ulong *)((long)src2 + lVar4) ^ *(ulong *)((long)src1 + lVar4);
      lVar1 = count + lVar2;
      lVar2 = lVar2 + -8;
      lVar4 = lVar4 + 8;
    } while (7 < lVar1 - 8U);
    count = count + lVar2;
    src2 = (void *)((long)src2 - lVar2);
    src1 = (void *)((long)src1 - lVar2);
    dest = (void *)((long)dest - lVar2);
  }
  if (count != 0) {
    sVar3 = 0;
    do {
      *(byte *)((long)dest + sVar3) = *(byte *)((long)src2 + sVar3) ^ *(byte *)((long)src1 + sVar3);
      sVar3 = sVar3 + 1;
    } while (count != sVar3);
  }
  return;
}

Assistant:

void memXor(void* dest, const void* src1, const void* src2, size_t count)
{
	ASSERT(memIsSameOrDisjoint(src1, dest, count));
	ASSERT(memIsSameOrDisjoint(src2, dest, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		*(word*)dest = *(const word*)src1 ^ *(const word*)src2;
		src1 = (const word*)src1 + 1;
		src2 = (const word*)src2 + 1;
		dest = (word*)dest + 1;
	}
	while (count--)
	{
		*(octet*)dest = *(const octet*)src1 ^ *(const octet*)src2;
		src1 = (const octet*)src1 + 1;
		src2 = (const octet*)src2 + 1;
		dest = (octet*)dest + 1;
	}
}